

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

bool CheckTxScriptsSanity(CMutableTransaction *tx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  uchar *puVar6;
  pointer pCVar7;
  pointer pCVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  CTransaction local_b0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&local_b0,tx);
  if ((long)local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    puVar1 = &((local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).n;
    puVar6 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (local_b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start,puVar1);
    uVar2 = *puVar1;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b0.vin);
    if (((uint32_t *)puVar6 != puVar1) || (uVar2 != 0xffffffff)) goto LAB_00127a75;
  }
  else {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b0.vin);
LAB_00127a75:
    pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish != pCVar7) {
      uVar9 = 0;
      uVar10 = 1;
      do {
        bVar4 = CScript::HasValidOps(&pCVar7[uVar9].scriptSig);
        if ((!bVar4) ||
           (pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start,
           0x272d < pCVar7[uVar9].scriptSig.super_CScriptBase._size)) goto LAB_00127b2d;
        uVar9 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar4 = uVar10 <= uVar9;
        lVar3 = uVar9 - uVar10;
        uVar9 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar4 && lVar3 != 0);
    }
  }
  pCVar8 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = true;
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish != pCVar8) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      bVar5 = CScript::HasValidOps(&pCVar8[uVar9].scriptPubKey);
      if ((!bVar5) ||
         (pCVar8 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start,
         0x272d < pCVar8[uVar9].scriptPubKey.super_CScriptBase._size)) goto LAB_00127b2d;
      uVar9 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar8 >> 3) * -0x3333333333333333;
      bVar5 = uVar10 <= uVar9;
      lVar3 = uVar9 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar5 && lVar3 != 0);
  }
LAB_00127b2f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
LAB_00127b2d:
  bVar4 = false;
  goto LAB_00127b2f;
}

Assistant:

static bool CheckTxScriptsSanity(const CMutableTransaction& tx)
{
    // Check input scripts for non-coinbase txs
    if (!CTransaction(tx).IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!tx.vin[i].scriptSig.HasValidOps() || tx.vin[i].scriptSig.size() > MAX_SCRIPT_SIZE) {
                return false;
            }
        }
    }
    // Check output scripts
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        if (!tx.vout[i].scriptPubKey.HasValidOps() || tx.vout[i].scriptPubKey.size() > MAX_SCRIPT_SIZE) {
            return false;
        }
    }

    return true;
}